

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O0

int __thiscall de::Socket::close(Socket *this,int __fd)

{
  deBool dVar1;
  SocketError *this_00;
  allocator<char> local_31;
  string local_30;
  Socket *local_10;
  Socket *this_local;
  
  local_10 = this;
  dVar1 = deSocket_close(this->m_socket);
  if (dVar1 == 0) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Closing socket failed",&local_31);
    SocketError::SocketError(this_00,&local_30);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  return dVar1;
}

Assistant:

void Socket::close (void)
{
	if (!deSocket_close(m_socket))
		throw SocketError("Closing socket failed");
}